

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

int phred_sum(string *phred,char phred_base)

{
  int iVar1;
  size_type sVar2;
  
  if (phred->_M_string_length != 0) {
    sVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = (int)(phred->_M_dataplus)._M_p[sVar2] + (iVar1 - phred_base);
      sVar2 = sVar2 + 1;
    } while (phred->_M_string_length != sVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int phred_sum(const string& phred, char phred_base=33) {
    int result = 0;
    for (size_t i=0; i<phred.size(); ++i) {
        result += phred[i] - phred_base;
    }
    return result;
}